

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O2

bool __thiscall LEFReader::parseMacro(LEFReader *this)

{
  string *tokstr;
  bool bVar1;
  __type_conflict _Var2;
  token_t tVar3;
  bool bVar4;
  string name;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  tVar3 = tokenize(this,&local_50);
  this->m_curtok = tVar3;
  if (tVar3 == TOK_IDENT) {
    tokstr = &this->m_tokstr;
    tVar3 = tokenize(this,tokstr);
    this->m_curtok = tVar3;
    if (tVar3 == TOK_EOL) {
      (*this->_vptr_LEFReader[2])(this,&local_50);
      bVar4 = false;
      do {
        tVar3 = tokenize(this,tokstr);
        this->m_curtok = tVar3;
        if (tVar3 == TOK_IDENT) {
          bVar1 = std::operator==(tokstr,"PIN");
          if (bVar1) {
            parsePin(this);
          }
          else {
            bVar1 = std::operator==(tokstr,"CLASS");
            if (bVar1) {
              parseClass(this);
            }
            else {
              bVar1 = std::operator==(tokstr,"ORIGIN");
              if (bVar1) {
                parseOrigin(this);
              }
              else {
                bVar1 = std::operator==(tokstr,"FOREIGN");
                if (bVar1) {
                  parseForeign(this);
                }
                else {
                  bVar1 = std::operator==(tokstr,"SIZE");
                  if (bVar1) {
                    parseSize(this);
                  }
                  else {
                    bVar1 = std::operator==(tokstr,"SYMMETRY");
                    if (bVar1) {
                      parseSymmetry(this);
                    }
                    else {
                      bVar1 = std::operator==(tokstr,"SITE");
                      if (bVar1) {
                        parseSite(this);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (bVar4) {
          bVar4 = true;
          if (this->m_curtok == TOK_IDENT) {
            _Var2 = std::operator==(tokstr,&local_50);
            bVar4 = true;
            bVar1 = true;
            if (_Var2) goto LAB_00125596;
          }
        }
        else {
          if (this->m_curtok == TOK_IDENT) {
            bVar1 = std::operator==(tokstr,"END");
            bVar4 = true;
            if (bVar1) goto LAB_00125507;
          }
          bVar4 = false;
        }
LAB_00125507:
      } while (((byte)this->m_is[*(long *)(*(long *)this->m_is + -0x18) + 0x20] & 2) == 0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Unexpected end of file\n",&local_71);
      error(this,&local_70);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Expected EOL\n",&local_71);
      error(this,&local_70);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Expected a macro name\n",&local_71);
    error(this,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = false;
LAB_00125596:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool LEFReader::parseMacro()
{
    std::string name;
    

    // macro name
    m_curtok = tokenize(name);
    if (m_curtok != TOK_IDENT)
    {
        error("Expected a macro name\n");
        return false;
    }

    //std::cout << "MACRO " << name << "\n"; 

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL\n");
        return false;
    }

    onMacro(name);

    // wait for 'END macroname'
    bool endFound = false;
    while(true)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok == TOK_IDENT)
        {
            if (m_tokstr == "PIN")
            {
                parsePin();
            }
            else if (m_tokstr == "CLASS")
            {
                parseClass();
            }            
            else if (m_tokstr == "ORIGIN")
            {
                parseOrigin();
            }
            else if (m_tokstr == "FOREIGN")
            {
                parseForeign();
            }
            else if (m_tokstr == "SIZE")
            {
                parseSize();
            }
            else if (m_tokstr == "SYMMETRY")
            {
                parseSymmetry();
            }
            else if (m_tokstr == "SITE")
            {
                parseSite();
            }
            //else if (m_tokstr == "LAYER")
            //{
            //    parseLayer();   // TECH LEF layer, not a port LAYER!
            //}  
        }

        if (endFound)
        {
            if ((m_curtok == TOK_IDENT) && (m_tokstr == name))
            {
                //cout << "END " << name << "\n";
                return true;
            }
        }
        else if ((m_curtok == TOK_IDENT) && (m_tokstr == "END"))
        {
            endFound = true;
        }
        else
        {
            endFound = false;
        }

        if (m_is->eof())
        {
            error("Unexpected end of file\n");
            return false;
        }        
    }
}